

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_piecewise_merge_join.cpp
# Opt level: O1

SinkFinalizeType __thiscall
duckdb::PhysicalPiecewiseMergeJoin::Finalize
          (PhysicalPiecewiseMergeJoin *this,Pipeline *pipeline,Event *event,ClientContext *context,
          OperatorSinkFinalizeInput *input)

{
  bool bVar1;
  SinkFinalizeType SVar2;
  pointer pGVar3;
  pointer this_00;
  byte bVar4;
  GlobalSinkState *this_01;
  
  this_01 = input->global_state + 1;
  pGVar3 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
           ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                         *)this_01);
  bVar1 = PropagatesBuildSide((this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.
                              super_PhysicalJoin.super_CachingPhysicalOperator.field_0x81);
  if (bVar1) {
    this_00 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
              ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                            *)this_01);
    PhysicalRangeJoin::GlobalSortedTable::IntializeMatches(this_00);
  }
  if ((((pGVar3->global_sort_state).sorted_blocks.
        super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pGVar3->global_sort_state).sorted_blocks.
        super_vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) ||
      (bVar4 = (this->super_PhysicalRangeJoin).super_PhysicalComparisonJoin.super_PhysicalJoin.
               super_CachingPhysicalOperator.field_0x81 - 2, 8 < bVar4)) ||
     (SVar2 = NO_OUTPUT_POSSIBLE, (0x18bU >> (bVar4 & 0x1f) & 1) == 0)) {
    pGVar3 = unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
             ::operator->((unique_ptr<duckdb::PhysicalRangeJoin::GlobalSortedTable,_std::default_delete<duckdb::PhysicalRangeJoin::GlobalSortedTable>,_true>
                           *)this_01);
    PhysicalRangeJoin::GlobalSortedTable::Finalize(pGVar3,pipeline,event);
    SVar2 = READY;
  }
  return SVar2;
}

Assistant:

SinkFinalizeType PhysicalPiecewiseMergeJoin::Finalize(Pipeline &pipeline, Event &event, ClientContext &context,
                                                      OperatorSinkFinalizeInput &input) const {
	auto &gstate = input.global_state.Cast<MergeJoinGlobalState>();
	auto &global_sort_state = gstate.table->global_sort_state;

	if (PropagatesBuildSide(join_type)) {
		// for FULL/RIGHT OUTER JOIN, initialize found_match to false for every tuple
		gstate.table->IntializeMatches();
	}
	if (global_sort_state.sorted_blocks.empty() && EmptyResultIfRHSIsEmpty()) {
		// Empty input!
		return SinkFinalizeType::NO_OUTPUT_POSSIBLE;
	}

	// Sort the current input child
	gstate.table->Finalize(pipeline, event);

	return SinkFinalizeType::READY;
}